

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_timeout.cpp
# Opt level: O0

void cppcms::impl::set_send_timeout(stream_socket *sock,int seconds)

{
  error_code eVar1;
  bool bVar2;
  undefined8 uVar3;
  error_code e;
  error_code *in_stack_ffffffffffffffb0;
  system_error *in_stack_ffffffffffffffc0;
  error_code *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  stream_socket *in_stack_ffffffffffffffe0;
  error_category *peStack_18;
  
  std::error_code::error_code(in_stack_ffffffffffffffb0);
  set_send_timeout(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
  bVar2 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe0);
  if (!bVar2) {
    return;
  }
  uVar3 = __cxa_allocate_exception(0x40);
  eVar1._M_cat = peStack_18;
  eVar1._0_8_ = in_stack_ffffffffffffffe0;
  booster::system::system_error::system_error(in_stack_ffffffffffffffc0,eVar1);
  __cxa_throw(uVar3,&booster::system::system_error::typeinfo,
              booster::system::system_error::~system_error);
}

Assistant:

void set_send_timeout(booster::aio::stream_socket &sock,int seconds)
{
	booster::system::error_code e;
	set_send_timeout(sock,seconds,e);
	if(e) {
		throw booster::system::system_error(e);
	}
}